

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

Gia_SimRsbMan_t * Gia_SimRsbAlloc(Gia_Man_t *pGia)

{
  int iVar1;
  int iVar2;
  Gia_SimRsbMan_t *pGVar3;
  word *pwVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Wrd_t *pVVar7;
  int iVar8;
  size_t __nmemb;
  
  pGVar3 = (Gia_SimRsbMan_t *)calloc(1,0x58);
  pGVar3->pGia = pGia;
  iVar1 = pGia->vSimsPi->nSize;
  iVar8 = pGia->vCis->nSize;
  iVar2 = iVar1 / iVar8;
  pGVar3->nWords = iVar2;
  if (iVar1 % iVar8 != 0) {
    __assert_fail("Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x17e,"Gia_SimRsbMan_t *Gia_SimRsbAlloc(Gia_Man_t *)");
  }
  __nmemb = (size_t)iVar2;
  pwVar4 = (word *)calloc(__nmemb,8);
  pGVar3->pFunc[0] = pwVar4;
  pwVar4 = (word *)calloc(__nmemb,8);
  pGVar3->pFunc[1] = pwVar4;
  pwVar4 = (word *)calloc(__nmemb,8);
  pGVar3->pFunc[2] = pwVar4;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(4000);
  pVVar5->pArray = piVar6;
  pGVar3->vTfo = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(4000);
  pVVar5->pArray = piVar6;
  pGVar3->vCands = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0x10;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(0x40);
  pVVar5->pArray = piVar6;
  pGVar3->vFanins = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0x10;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(0x40);
  pVVar5->pArray = piVar6;
  pGVar3->vFanins2 = pVVar5;
  pVVar7 = Gia_ManSimPatSim(pGia);
  pGVar3->vSimsObj = pVVar7;
  iVar1 = pVVar7->nSize;
  pVVar7 = (Vec_Wrd_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar8 = iVar1;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar8;
  if (iVar8 == 0) {
    pwVar4 = (word *)0x0;
  }
  else {
    pwVar4 = (word *)malloc((long)iVar8 << 3);
  }
  pVVar7->pArray = pwVar4;
  pVVar7->nSize = iVar1;
  memset(pwVar4,0,(long)iVar1 << 3);
  pGVar3->vSimsObj2 = pVVar7;
  if (iVar2 == iVar1 / pGia->nObjs) {
    Gia_ManStaticFanoutStart(pGia);
    return pGVar3;
  }
  __assert_fail("p->nWords == Vec_WrdSize(p->vSimsObj) / Gia_ManObjNum(pGia)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x188,"Gia_SimRsbMan_t *Gia_SimRsbAlloc(Gia_Man_t *)");
}

Assistant:

Gia_SimRsbMan_t * Gia_SimRsbAlloc( Gia_Man_t * pGia )
{
    Gia_SimRsbMan_t * p = ABC_CALLOC( Gia_SimRsbMan_t, 1 );
    p->pGia      = pGia;
    p->nWords    = Vec_WrdSize(pGia->vSimsPi) / Gia_ManCiNum(pGia); assert( Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0 );
    p->pFunc[0]  = ABC_CALLOC( word, p->nWords );
    p->pFunc[1]  = ABC_CALLOC( word, p->nWords );
    p->pFunc[2]  = ABC_CALLOC( word, p->nWords );
    p->vTfo      = Vec_IntAlloc( 1000 );
    p->vCands    = Vec_IntAlloc( 1000 );
    p->vFanins   = Vec_IntAlloc( 10 );
    p->vFanins2  = Vec_IntAlloc( 10 );
    p->vSimsObj  = Gia_ManSimPatSim( pGia );
    p->vSimsObj2 = Vec_WrdStart( Vec_WrdSize(p->vSimsObj) );
    assert( p->nWords == Vec_WrdSize(p->vSimsObj) / Gia_ManObjNum(pGia) );
    Gia_ManStaticFanoutStart( pGia );
    return p;
}